

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SameLine(float offset_from_start_x,float spacing_w)

{
  ImGuiWindow *pIVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  ImGuiContext *g;
  ImGuiWindow *window;
  float local_8;
  
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->SkipItems & 1U) == 0) {
    local_8 = in_XMM1_Da;
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      if (in_XMM1_Da < 0.0) {
        local_8 = 0.0;
      }
      (pIVar1->DC).CursorPos.x =
           ((pIVar1->Pos).x - (pIVar1->Scroll).x) + in_XMM0_Da + local_8 +
           (pIVar1->DC).GroupOffset.x + (pIVar1->DC).ColumnsOffset.x;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    else {
      if (in_XMM1_Da < 0.0) {
        local_8 = (GImGui->Style).ItemSpacing.x;
      }
      (pIVar1->DC).CursorPos.x = (pIVar1->DC).CursorPosPrevLine.x + local_8;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  return;
}

Assistant:

void ImGui::SameLine(float offset_from_start_x, float spacing_w)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    if (offset_from_start_x != 0.0f)
    {
        if (spacing_w < 0.0f) spacing_w = 0.0f;
        window->DC.CursorPos.x = window->Pos.x - window->Scroll.x + offset_from_start_x + spacing_w + window->DC.GroupOffset.x + window->DC.ColumnsOffset.x;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    else
    {
        if (spacing_w < 0.0f) spacing_w = g.Style.ItemSpacing.x;
        window->DC.CursorPos.x = window->DC.CursorPosPrevLine.x + spacing_w;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    window->DC.CurrLineSize = window->DC.PrevLineSize;
    window->DC.CurrLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
}